

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O2

int __thiscall
absl::strings_internal::BigUnsigned<84>::ReadFloatMantissa
          (BigUnsigned<84> *this,ParsedFloat *fp,int significant_digits)

{
  ulong uVar1;
  int iVar2;
  
  SetToZero(this);
  if (fp->type != kNumber) {
    __assert_fail("fp.type == FloatType::kNumber",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/internal/charconv_bigint.cc"
                  ,0xae,
                  "int absl::strings_internal::BigUnsigned<84>::ReadFloatMantissa(const ParsedFloat &, int) [max_words = 84]"
                 );
  }
  if (fp->subrange_begin != (char *)0x0) {
    iVar2 = ReadDigits(this,fp->subrange_begin,fp->subrange_end,significant_digits);
    return iVar2 + fp->literal_exponent;
  }
  uVar1 = fp->mantissa;
  *(ulong *)this->words_ = uVar1;
  if (uVar1 >> 0x20 == 0) {
    if ((int)uVar1 == 0) goto LAB_001172c9;
    iVar2 = 1;
  }
  else {
    iVar2 = 2;
  }
  this->size_ = iVar2;
LAB_001172c9:
  return fp->exponent;
}

Assistant:

int BigUnsigned<max_words>::ReadFloatMantissa(const ParsedFloat& fp,
                                              int significant_digits) {
  SetToZero();
  assert(fp.type == FloatType::kNumber);

  if (fp.subrange_begin == nullptr) {
    // We already exactly parsed the mantissa, so no more work is necessary.
    words_[0] = fp.mantissa & 0xffffffffu;
    words_[1] = fp.mantissa >> 32;
    if (words_[1]) {
      size_ = 2;
    } else if (words_[0]) {
      size_ = 1;
    }
    return fp.exponent;
  }
  int exponent_adjust =
      ReadDigits(fp.subrange_begin, fp.subrange_end, significant_digits);
  return fp.literal_exponent + exponent_adjust;
}